

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O0

rf_mat * rf_get_camera_matrix2d(rf_camera2d camera)

{
  rf_mat left;
  rf_mat left_00;
  rf_mat left_01;
  rf_mat right;
  rf_mat right_00;
  rf_mat right_01;
  rf_mat *in_RDI;
  float in_stack_00000008;
  float in_stack_0000000c;
  undefined8 in_stack_fffffffffffffdf8;
  rf_mat *mat_transform;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined1 local_168 [64];
  undefined1 auStack_128 [8];
  rf_mat mat_translation;
  rf_mat mat_scale;
  undefined1 auStack_88 [8];
  rf_mat mat_rotation;
  rf_mat mat_origin;
  
  in_RDI->m3 = 0.0;
  in_RDI->m7 = 0.0;
  in_RDI->m11 = 0.0;
  in_RDI->m15 = 0.0;
  in_RDI->m2 = 0.0;
  in_RDI->m6 = 0.0;
  in_RDI->m10 = 0.0;
  in_RDI->m14 = 0.0;
  in_RDI->m1 = 0.0;
  in_RDI->m5 = 0.0;
  in_RDI->m9 = 0.0;
  in_RDI->m13 = 0.0;
  in_RDI->m0 = 0.0;
  in_RDI->m4 = 0.0;
  in_RDI->m8 = 0.0;
  in_RDI->m12 = 0.0;
  rf_mat_translate((rf_mat *)&mat_rotation.m11,-camera.offset.x,-camera.offset.y,0.0);
  rf_mat_rotate((rf_mat *)auStack_88,(rf_vec3)(ZEXT412(0x3f800000) << 0x40),
                camera.target.x * 0.017453292);
  rf_mat_scale((rf_mat *)&mat_translation.m11,camera.target.y,camera.target.y,1.0);
  rf_mat_translate((rf_mat *)auStack_128,in_stack_00000008,in_stack_0000000c,0.0);
  left._8_8_ = mat_scale._8_8_;
  left._0_8_ = mat_scale._0_8_;
  left._16_8_ = mat_scale._16_8_;
  left._24_8_ = mat_scale._24_8_;
  left._32_8_ = mat_scale._32_8_;
  left._40_8_ = mat_scale._40_8_;
  left._48_8_ = mat_scale._48_8_;
  left.m11 = (float)auStack_88._0_4_;
  left.m15 = (float)auStack_88._4_4_;
  right.m8 = mat_rotation.m8;
  right.m12 = mat_rotation.m12;
  right.m0 = mat_rotation.m0;
  right.m4 = mat_rotation.m4;
  right.m1 = mat_rotation.m1;
  right.m5 = mat_rotation.m5;
  right.m9 = mat_rotation.m9;
  right.m13 = mat_rotation.m13;
  right.m2 = mat_rotation.m2;
  right.m6 = mat_rotation.m6;
  right.m10 = mat_rotation.m10;
  right.m14 = mat_rotation.m14;
  right.m3 = mat_rotation.m3;
  right.m7 = mat_rotation.m7;
  right.m11 = (float)(int)in_stack_fffffffffffffdf8;
  right.m15 = (float)(int)((ulong)in_stack_fffffffffffffdf8 >> 0x20);
  rf_mat_mul(left,right);
  left_00._8_8_ = mat_origin._8_8_;
  left_00._0_8_ = mat_origin._0_8_;
  left_00._16_8_ = mat_origin._16_8_;
  left_00._24_8_ = mat_origin._24_8_;
  left_00._32_8_ = mat_origin._32_8_;
  left_00._40_8_ = mat_origin._40_8_;
  left_00._48_8_ = mat_origin._48_8_;
  left_00._56_8_ = local_1e8;
  right_00._8_8_ = local_1d8;
  right_00._0_8_ = uStack_1e0;
  right_00._16_8_ = uStack_1d0;
  right_00._24_8_ = local_1c8;
  right_00._32_8_ = uStack_1c0;
  right_00._40_8_ = local_1b8;
  right_00._48_8_ = uStack_1b0;
  right_00.m11 = (float)(int)in_stack_fffffffffffffdf8;
  right_00.m15 = (float)(int)((ulong)in_stack_fffffffffffffdf8 >> 0x20);
  rf_mat_mul(left_00,right_00);
  left_01._8_8_ = local_198;
  left_01._0_8_ = uStack_1a0;
  left_01._16_8_ = uStack_190;
  left_01._24_8_ = local_188;
  left_01._32_8_ = uStack_180;
  left_01._40_8_ = local_178;
  left_01._48_8_ = uStack_170;
  left_01.m11 = (float)auStack_128._0_4_;
  left_01.m15 = (float)auStack_128._4_4_;
  right_01.m8 = mat_translation.m8;
  right_01.m12 = mat_translation.m12;
  right_01.m0 = mat_translation.m0;
  right_01.m4 = mat_translation.m4;
  right_01.m1 = mat_translation.m1;
  right_01.m5 = mat_translation.m5;
  right_01.m9 = mat_translation.m9;
  right_01.m13 = mat_translation.m13;
  right_01.m2 = mat_translation.m2;
  right_01.m6 = mat_translation.m6;
  right_01.m10 = mat_translation.m10;
  right_01.m14 = mat_translation.m14;
  right_01.m3 = mat_translation.m3;
  right_01.m7 = mat_translation.m7;
  right_01.m11 = (float)(int)in_stack_fffffffffffffdf8;
  right_01.m15 = (float)(int)((ulong)in_stack_fffffffffffffdf8 >> 0x20);
  rf_mat_mul(left_01,right_01);
  memcpy(in_RDI,local_168,0x40);
  return in_RDI;
}

Assistant:

RF_API rf_mat rf_get_camera_matrix2d(rf_camera2d camera)
{
    rf_mat mat_transform = {0};
// The camera in world-space is set by
//   1. Move it to target
//   2. Rotate by -rotation and scale by (1/zoom)
//      When setting higher scale, it's more intuitive for the world to become bigger (= camera become smaller),
//      not for the camera getting bigger, hence the invert. Same deal with rotation.
//   3. Move it by (-offset);
//      Offset defines target transform relative to screen, but since we're effectively "moving" screen (camera)
//      we need to do it into opposite direction (inverse transform)

// Having camera transform in world-space, inverse of it gives the rf_gfxobal_model_view transform.
// Since (A*B*C)' = C'*B'*A', the rf_gfxobal_model_view is
//   1. Move to offset
//   2. Rotate and Scale
//   3. Move by -target
    rf_mat mat_origin = rf_mat_translate(-camera.target.x, -camera.target.y, 0.0f);
    rf_mat mat_rotation = rf_mat_rotate((rf_vec3) {0.0f, 0.0f, 1.0f}, camera.rotation * RF_DEG2RAD);
    rf_mat mat_scale = rf_mat_scale(camera.zoom, camera.zoom, 1.0f);
    rf_mat mat_translation = rf_mat_translate(camera.offset.x, camera.offset.y, 0.0f);

    mat_transform = rf_mat_mul(rf_mat_mul(mat_origin, rf_mat_mul(mat_scale, mat_rotation)), mat_translation);

    return mat_transform;
}